

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableModel::setData(QTableModel *this,QModelIndex *index,QVariant *value,int role)

{
  bool bVar1;
  int iVar2;
  QTableWidgetItem *pQVar3;
  QTableWidget *this_00;
  uint in_ECX;
  undefined8 in_RDX;
  QModelIndex *in_RSI;
  QTableModel *in_RDI;
  QTableWidget *view;
  QTableWidgetItem *itm;
  QModelIndex *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  QTableModel *in_stack_ffffffffffffffc8;
  bool local_1;
  
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffffb0);
  if (bVar1) {
    pQVar3 = item(in_stack_ffffffffffffffc8,(QModelIndex *)in_RDI);
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      bVar1 = ::QVariant::isValid((QVariant *)in_stack_ffffffffffffffb0);
      if (bVar1) {
        this_00 = QTableModel::view((QTableModel *)0x8d5e56);
        if (this_00 == (QTableWidget *)0x0) {
          local_1 = false;
        }
        else {
          pQVar3 = createItem(in_RDI);
          (*pQVar3->_vptr_QTableWidgetItem[4])(pQVar3,(ulong)in_ECX,in_RDX);
          iVar2 = QModelIndex::row(in_RSI);
          QModelIndex::column(in_RSI);
          QTableWidget::setItem
                    (this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (QTableWidgetItem *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      (*pQVar3->_vptr_QTableWidgetItem[4])(pQVar3,(ulong)in_ECX,in_RDX);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QTableModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (!index.isValid())
        return false;

    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->setData(role, value);
        return true;
    }

    // don't create dummy table items for empty values
    if (!value.isValid())
        return false;

    QTableWidget *view = this->view();
    if (!view)
        return false;

    itm = createItem();
    itm->setData(role, value);
    view->setItem(index.row(), index.column(), itm);
    return true;
}